

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

bool __thiscall re2::RE2::CheckRewriteString(RE2 *this,StringPiece *rewrite,string *error)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  const_pointer pcVar5;
  size_type sVar6;
  string *in_RDX;
  StringPiece *in_RSI;
  RE2 *in_RDI;
  int n;
  int c;
  char *end;
  char *s;
  int max_token;
  string local_60 [32];
  uint local_40;
  int local_3c;
  char *local_38;
  char *local_30;
  uint local_24;
  string *local_20;
  StringPiece *local_18;
  
  local_24 = 0xffffffff;
  local_20 = in_RDX;
  local_18 = in_RSI;
  pcVar5 = StringPiece::data(in_RSI);
  local_30 = pcVar5;
  sVar6 = StringPiece::size(local_18);
  local_38 = pcVar5 + sVar6;
  do {
    uVar1 = local_24;
    if (local_38 <= local_30) {
      iVar3 = NumberOfCapturingGroups(in_RDI);
      uVar2 = local_24;
      if ((int)uVar1 > iVar3) {
        uVar4 = NumberOfCapturingGroups(in_RDI);
        StringPrintf_abi_cxx11_
                  ((char *)local_60,
                   "Rewrite schema requests %d matches, but the regexp only has %d parenthesized subexpressions."
                   ,(ulong)uVar2,(ulong)uVar4);
        std::__cxx11::string::operator=(local_20,local_60);
        std::__cxx11::string::~string(local_60);
      }
      return (int)uVar1 <= iVar3;
    }
    local_3c = (int)*local_30;
    if (local_3c == 0x5c) {
      local_30 = local_30 + 1;
      if (local_30 == local_38) {
        std::__cxx11::string::operator=(local_20,"Rewrite schema error: \'\\\' not allowed at end.")
        ;
        return false;
      }
      local_3c = (int)*local_30;
      if (local_3c != 0x5c) {
        iVar3 = isdigit(local_3c);
        if (iVar3 == 0) {
          std::__cxx11::string::operator=
                    (local_20,"Rewrite schema error: \'\\\' must be followed by a digit or \'\\\'.")
          ;
          return false;
        }
        local_40 = local_3c - 0x30;
        if ((int)local_24 < (int)local_40) {
          local_24 = local_40;
        }
      }
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

bool RE2::CheckRewriteString(const StringPiece& rewrite,
                             std::string* error) const {
  int max_token = -1;
  for (const char *s = rewrite.data(), *end = s + rewrite.size();
       s < end; s++) {
    int c = *s;
    if (c != '\\') {
      continue;
    }
    if (++s == end) {
      *error = "Rewrite schema error: '\\' not allowed at end.";
      return false;
    }
    c = *s;
    if (c == '\\') {
      continue;
    }
    if (!isdigit(c)) {
      *error = "Rewrite schema error: "
               "'\\' must be followed by a digit or '\\'.";
      return false;
    }
    int n = (c - '0');
    if (max_token < n) {
      max_token = n;
    }
  }

  if (max_token > NumberOfCapturingGroups()) {
    *error = StringPrintf(
        "Rewrite schema requests %d matches, but the regexp only has %d "
        "parenthesized subexpressions.",
        max_token, NumberOfCapturingGroups());
    return false;
  }
  return true;
}